

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

id gpt_sample_top_k_top_p
             (gpt_vocab *vocab,float *logits,int top_k,double top_p,double temp,mt19937 *rng)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __wbegin;
  bool bVar1;
  result_type_conflict rVar2;
  size_type sVar3;
  reference pdVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  int in_EDX;
  long in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  pair<double,_int> pVar8;
  int idx;
  discrete_distribution<int> dist;
  int i_2;
  int i_1;
  double cumsum;
  double *p_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  double p;
  pair<double,_int> *kv_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *__range1_1;
  double sum;
  vector<double,_std::allocator<double>_> probs;
  pair<double,_int> *kv;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *__range1;
  double maxl;
  int i;
  double scale;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> logits_id;
  int n_logits;
  undefined4 in_stack_fffffffffffffe08;
  id iVar9;
  undefined4 in_stack_fffffffffffffe0c;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
  *in_stack_fffffffffffffe10;
  discrete_distribution<int> *pdVar10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  size_type in_stack_fffffffffffffe28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe30;
  size_type in_stack_fffffffffffffe38;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *__n;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int local_160;
  int local_15c;
  double local_158;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_140;
  discrete_distribution<int> *local_138;
  double local_130;
  reference local_128;
  pair<double,_int> *local_120;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_118;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *local_110;
  double local_108;
  discrete_distribution<int> local_100;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *local_d0;
  pointer local_c8 [2];
  pair<double,_int> *local_b8;
  pair<double,_int> *local_b0;
  pair<double,_int> *local_a8;
  pair<double,_int> *local_a0;
  double local_98;
  int local_90;
  double local_88;
  double local_80;
  int local_78;
  int local_6c;
  double local_68;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_50;
  int local_34;
  double local_28;
  double local_20;
  int local_14;
  long local_10;
  
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_14 = in_EDX;
  local_10 = in_RSI;
  sVar3 = std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x126919);
  local_34 = (int)sVar3;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x126932);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  local_68 = 1.0 / local_28;
  for (local_6c = 0; local_6c < local_34; local_6c = local_6c + 1) {
    local_88 = (double)*(float *)(local_10 + (long)local_6c * 4) * local_68;
    pVar8 = std::make_pair<double,int&>
                      ((double *)in_stack_fffffffffffffe10,
                       (int *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_98 = pVar8.first;
    in_stack_fffffffffffffe44 = pVar8.second;
    local_90 = in_stack_fffffffffffffe44;
    local_80 = local_98;
    local_78 = in_stack_fffffffffffffe44;
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
              (in_stack_fffffffffffffe10,
               (value_type *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  }
  __n = &local_50;
  local_a0 = (pair<double,_int> *)
             std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                       ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_b0 = (pair<double,_int> *)
             std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                       ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_a8 = (pair<double,_int> *)
             __gnu_cxx::
             __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
             ::operator+((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                          *)in_stack_fffffffffffffe18._M_current,
                         (difference_type)in_stack_fffffffffffffe10);
  local_b8 = (pair<double,_int> *)
             std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                       ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  std::
  partial_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,gpt_sample_top_k_top_p(gpt_vocab_const&,float_const*,int,double,double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>
            (local_a0,local_a8,local_b8);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_c8[0] = (pointer)0xfff0000000000000;
  local_d0 = &local_50;
  local_100._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                          ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_100._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                          ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             *)in_stack_fffffffffffffe10,
                            (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)), bVar1
        ) {
    local_100._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         &__gnu_cxx::
          __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
          ::operator*((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                       *)((long)&local_100._M_param._M_cp.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + 0x10))->first;
    in_stack_fffffffffffffe30 =
         (vector<double,_std::allocator<double>_> *)
         std::max<double>((double *)local_c8,
                          local_100._M_param._M_cp.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    local_c8[0] = (((_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     *)&in_stack_fffffffffffffe30->
                        super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
                  super__Vector_impl_data._M_start;
    __gnu_cxx::
    __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
    ::operator++((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  *)((long)&local_100._M_param._M_cp.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + 0x10));
  }
  pdVar10 = &local_100;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x126baa);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::size(&local_50);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),(size_type)__n);
  local_108 = 0.0;
  local_110 = &local_50;
  local_118._M_current =
       (pair<double,_int> *)
       std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                 ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                  CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_120 = (pair<double,_int> *)
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             *)in_stack_fffffffffffffe10,
                            (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)), bVar1
        ) {
    local_128 = __gnu_cxx::
                __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                ::operator*(&local_118);
    local_130 = exp(local_128->first - (double)local_c8[0]);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18._M_current);
    local_108 = local_130 + local_108;
    __gnu_cxx::
    __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
    ::operator++(&local_118);
  }
  local_138 = &local_100;
  local_140._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)
                  CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffe10,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)), bVar1
        ) {
    pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_140);
    *pdVar4 = *pdVar4 / local_108;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_140);
  }
  if (local_20 < 1.0) {
    local_158 = 0.0;
    for (local_15c = 0; local_15c < local_14; local_15c = local_15c + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_100,(long)local_15c);
      local_158 = *pvVar5 + local_158;
      if (local_20 <= local_158) {
        local_14 = local_15c + 1;
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffe30,(size_type)pdVar10);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   in_stack_fffffffffffffe30,(size_type)pdVar10);
        break;
      }
    }
    local_160 = 0;
    while (in_stack_fffffffffffffe24 = local_160,
          sVar6 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)&local_100),
          in_stack_fffffffffffffe24 < (int)sVar6) {
      in_stack_fffffffffffffe18._M_current = (double *)(1.0 / local_158);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_100,(long)local_160);
      *pvVar5 = (double)in_stack_fffffffffffffe18._M_current * *pvVar5;
      local_160 = local_160 + 1;
    }
  }
  pdVar10 = &local_100;
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  __wbegin._M_current._4_4_ = in_stack_fffffffffffffe24;
  __wbegin._M_current._0_4_ = in_stack_fffffffffffffe20;
  std::discrete_distribution<int>::
  discrete_distribution<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (pdVar10,__wbegin,in_stack_fffffffffffffe18);
  rVar2 = std::discrete_distribution<int>::operator()
                    (pdVar10,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  pvVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::operator[]
                     (&local_50,(long)rVar2);
  iVar9 = pvVar7->second;
  std::discrete_distribution<int>::~discrete_distribution((discrete_distribution<int> *)0x126f3f);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  return iVar9;
}

Assistant:

gpt_vocab::id gpt_sample_top_k_top_p(
        const gpt_vocab & vocab,
        const float * logits,
        int    top_k,
        double top_p,
        double temp,
        std::mt19937 & rng) {
    int n_logits = vocab.id_to_token.size();

    std::vector<std::pair<double, gpt_vocab::id>> logits_id;
    logits_id.reserve(n_logits);

    {
        const double scale = 1.0/temp;
        for (int i = 0; i < n_logits; ++i) {
            logits_id.push_back(std::make_pair(logits[i]*scale, i));
        }
    }

    // find the top K tokens
    std::partial_sort(
            logits_id.begin(),
            logits_id.begin() + top_k, logits_id.end(),
            [](const std::pair<double, gpt_vocab::id> & a, const std::pair<double, gpt_vocab::id> & b) {
        return a.first > b.first;
    });

    logits_id.resize(top_k);

    double maxl = -INFINITY;
    for (const auto & kv : logits_id) {
        maxl = std::max(maxl, kv.first);
    }

    // compute probs for the top K tokens
    std::vector<double> probs;
    probs.reserve(logits_id.size());

    double sum = 0.0;
    for (const auto & kv : logits_id) {
        double p = exp(kv.first - maxl);
        probs.push_back(p);
        sum += p;
    }

    // normalize the probs
    for (auto & p : probs) {
        p /= sum;
    }

    if (top_p < 1.0f) {
        double cumsum = 0.0f;
        for (int i = 0; i < top_k; i++) {
            cumsum += probs[i];
            if (cumsum >= top_p) {
                top_k = i + 1;
                probs.resize(top_k);
                logits_id.resize(top_k);
                break;
            }
        }

        cumsum = 1.0/cumsum;
        for (int i = 0; i < (int) probs.size(); i++) {
            probs[i] *= cumsum;
        }
    }

    //printf("\n");
    //for (int i = 0; i < (int) probs.size(); i++) {
    //    printf("%d: '%s' %f\n", i, vocab.id_to_token.at(logits_id[i].second).c_str(), probs[i]);
    //}
    //exit(0);

    std::discrete_distribution<> dist(probs.begin(), probs.end());
    int idx = dist(rng);

    return logits_id[idx].second;
}